

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O2

void utf8_to_ascii_test(void)

{
  ostream *poVar1;
  byte *pbVar2;
  int in_R8D;
  string local_d0;
  string b;
  string local_90;
  string a;
  allocator<char> local_50 [32];
  string local_30;
  
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_4a79);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&b,anon_var_dwarf_4a79,(allocator<char> *)&local_30);
  QUtil::utf8_to_ascii(&a,&b,'?');
  poVar1 = std::operator<<(poVar1,(string *)&a);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,anon_var_dwarf_4a79,local_50);
  QUtil::utf8_to_ascii(&local_d0,&local_90,'*');
  poVar1 = std::operator<<(poVar1,(string *)&local_d0);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&a);
  std::__cxx11::string::~string((string *)&b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&b,anon_var_dwarf_4a79,(allocator<char> *)&local_d0);
  QUtil::utf8_to_win_ansi(&a,&b,'*');
  std::__cxx11::string::~string((string *)&b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,anon_var_dwarf_4a79,(allocator<char> *)&local_90);
  QUtil::utf8_to_mac_roman(&b,&local_d0,'*');
  std::__cxx11::string::~string((string *)&local_d0);
  poVar1 = std::operator<<((ostream *)&std::cout,"<");
  pbVar2 = (byte *)std::__cxx11::string::at((ulong)&a);
  QUtil::int_to_string_base_abi_cxx11_(&local_d0,(QUtil *)(ulong)*pbVar2,0x10,2,in_R8D);
  poVar1 = std::operator<<(poVar1,(string *)&local_d0);
  poVar1 = std::operator<<(poVar1,">");
  std::__cxx11::string::substr((ulong)&local_90,(ulong)&a);
  poVar1 = std::operator<<(poVar1,(string *)&local_90);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"<");
  pbVar2 = (byte *)std::__cxx11::string::at((ulong)&b);
  QUtil::int_to_string_base_abi_cxx11_(&local_30,(QUtil *)(ulong)*pbVar2,0x10,2,in_R8D);
  poVar1 = std::operator<<(poVar1,(string *)&local_30);
  poVar1 = std::operator<<(poVar1,">");
  std::__cxx11::string::substr((ulong)local_50,(ulong)&b);
  poVar1 = std::operator<<(poVar1,(string *)local_50);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&b);
  std::__cxx11::string::~string((string *)&a);
  return;
}

Assistant:

void
utf8_to_ascii_test()
{
    char const* input = "\302\277Does \317\200 have fingers?";
    std::cout << input << std::endl
              << QUtil::utf8_to_ascii(input) << std::endl
              << QUtil::utf8_to_ascii(input, '*') << std::endl;
    std::string a = QUtil::utf8_to_win_ansi(input, '*');
    std::string b = QUtil::utf8_to_mac_roman(input, '*');
    std::cout << "<" << QUtil::int_to_string_base(static_cast<unsigned char>(a.at(0)), 16, 2) << ">"
              << a.substr(1) << std::endl
              << "<" << QUtil::int_to_string_base(static_cast<unsigned char>(b.at(0)), 16, 2) << ">"
              << b.substr(1) << std::endl;
}